

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O0

void __thiscall LLVMBC::UnaryOperator::UnaryOperator(UnaryOperator *this,UnaryOps uop,Value *value)

{
  initializer_list<LLVMBC::Value_*> __l;
  Type *type;
  allocator_type local_51;
  Value *local_50;
  iterator local_48;
  undefined8 local_40;
  vector<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_> local_38;
  Value *local_20;
  Value *value_local;
  UnaryOperator *pUStack_10;
  UnaryOps uop_local;
  UnaryOperator *this_local;
  
  local_20 = value;
  value_local._4_4_ = uop;
  pUStack_10 = this;
  type = Value::getType(value);
  Instruction::Instruction(&this->super_Instruction,type,UnaryOperator);
  local_50 = local_20;
  local_48 = &local_50;
  local_40 = 1;
  __l._M_len = 1;
  __l._M_array = local_48;
  std::vector<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>::vector
            (&local_38,__l,&local_51);
  Instruction::set_operands(&this->super_Instruction,&local_38);
  std::vector<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>::~vector(&local_38)
  ;
  return;
}

Assistant:

UnaryOperator::UnaryOperator(UnaryOps uop, Value *value)
    : Instruction(value->getType(), ValueKind::UnaryOperator)
{
	set_operands({ value });
}